

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_uri_parameter(char *zFilename,char *zParam)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (zParam != (char *)0x0 && zFilename != (char *)0x0) {
    sVar2 = strlen(zFilename);
    uVar3 = (ulong)((uint)sVar2 & 0x3fffffff);
    if (zFilename[uVar3 + 1] != '\0') {
      pcVar4 = zFilename + uVar3 + 1;
      do {
        iVar1 = strcmp(pcVar4,zParam);
        sVar2 = strlen(pcVar4);
        pcVar4 = pcVar4 + (ulong)((uint)sVar2 & 0x3fffffff) + 1;
        if (iVar1 == 0) {
          return pcVar4;
        }
        sVar2 = strlen(pcVar4);
        pcVar4 = pcVar4 + (ulong)((uint)sVar2 & 0x3fffffff) + 1;
      } while (*pcVar4 != '\0');
    }
  }
  return (char *)0x0;
}

Assistant:

SQLITE_API const char *sqlite3_uri_parameter(const char *zFilename, const char *zParam){
  if( zFilename==0 || zParam==0 ) return 0;
  zFilename += sqlite3Strlen30(zFilename) + 1;
  while( zFilename[0] ){
    int x = strcmp(zFilename, zParam);
    zFilename += sqlite3Strlen30(zFilename) + 1;
    if( x==0 ) return zFilename;
    zFilename += sqlite3Strlen30(zFilename) + 1;
  }
  return 0;
}